

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
ParserTOICompactRewardDecPOMDPDiscrete::StoreDecPOMDP
          (ParserTOICompactRewardDecPOMDPDiscrete *this,DecPOMDPDiscrete *decpomdp,Index id)

{
  TOICompactRewardDecPOMDPDiscrete *this_00;
  DecPOMDPDiscrete *in_RSI;
  DecPOMDPDiscrete *in_RDI;
  MultiAgentDecisionProcessDiscrete *madp;
  MultiAgentDecisionProcessDiscrete *in_stack_00000188;
  DecPOMDPDiscrete *in_stack_00000190;
  Index in_stack_ffffffffffffffcc;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffffd0;
  Index agentID;
  
  this_00 = (TOICompactRewardDecPOMDPDiscrete *)
            TransitionObservationIndependentMADPDiscrete::GetIndividualMADPD
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  DecPOMDPDiscrete::ExtractMADPDiscrete(in_stack_00000190,in_stack_00000188);
  agentID = (Index)((ulong)*(undefined8 *)
                            &(in_RDI->super_MultiAgentDecisionProcessDiscrete).
                             super_MultiAgentDecisionProcess._m_name._m_name >> 0x20);
  DecPOMDPDiscrete::GetRewardModelPtr(in_RSI);
  TOICompactRewardDecPOMDPDiscrete::SetIndividualRewardModel(this_00,(RewardModel *)in_RDI,agentID);
  TOIDecPOMDPDiscrete::SetIndividualDecPOMDPD(&this_00->super_TOIDecPOMDPDiscrete,in_RDI,agentID);
  return;
}

Assistant:

void ParserTOICompactRewardDecPOMDPDiscrete::
StoreDecPOMDP(DecPOMDPDiscrete *decpomdp,
              Index id)
{
    MultiAgentDecisionProcessDiscrete* madp = 
        _m_problem->GetIndividualMADPD(id);

    decpomdp->ExtractMADPDiscrete(madp);
    _m_problem->SetIndividualRewardModel(decpomdp->GetRewardModelPtr(), id);

    _m_problem->SetIndividualDecPOMDPD(decpomdp,id);
}